

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * wasm::Path::getBinaryenRoot_abi_cxx11_(void)

{
  char *__s;
  string *in_RDI;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  char *local_18;
  char *envVar;
  
  __s = getenv("BINARYEN_ROOT");
  local_18 = __s;
  if (__s == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,".",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,__s,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  return in_RDI;
}

Assistant:

std::string getBinaryenRoot() {
  auto* envVar = getenv("BINARYEN_ROOT");
  if (envVar) {
    return envVar;
  }
  return ".";
}